

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O0

void test_evp_fp_nan(void)

{
  double dVar1;
  bool bVar2;
  reference_type pdVar3;
  storage_type *psVar4;
  double v;
  compact_optional<ak_toolbox::compact_optional_ns::evp_fp_nan<double>,_ak_toolbox::compact_optional_ns::default_tag>
  local_28;
  opt_double oNan;
  compact_optional<ak_toolbox::compact_optional_ns::evp_fp_nan<double>,_ak_toolbox::compact_optional_ns::default_tag>
  local_18;
  opt_double o1;
  opt_double o_;
  
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_fp_nan<double>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&o1);
  oNan.super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_fp_nan<double>_>.super_type.
  value_ = (compact_optional_base<ak_toolbox::compact_optional_ns::evp_fp_nan<double>_>)
           (type)0x3ff0000000000000;
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_fp_nan<double>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&local_18,(value_type *)&oNan);
  v = NAN;
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_fp_nan<double>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&local_28,&v);
  bVar2 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_fp_nan<double>_>::has_value
                    (&o1.
                      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_fp_nan<double>_>
                    );
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!o_.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x82,"void test_evp_fp_nan()");
  }
  bVar2 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_fp_nan<double>_>::has_value
                    (&local_18.
                      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_fp_nan<double>_>
                    );
  if (!bVar2) {
    __assert_fail("o1.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x83,"void test_evp_fp_nan()");
  }
  bVar2 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_fp_nan<double>_>::has_value
                    (&local_28.
                      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_fp_nan<double>_>
                    );
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!oNan.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x84,"void test_evp_fp_nan()");
  }
  pdVar3 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_fp_nan<double>_>::value
                     (&local_18.
                       super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_fp_nan<double>_>
                     );
  if ((*pdVar3 != 1.0) || (NAN(*pdVar3))) {
    __assert_fail("o1.value() == 1.0",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x86,"void test_evp_fp_nan()");
  }
  psVar4 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_fp_nan<double>_>::
           unsafe_raw_value(&o1.
                             super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_fp_nan<double>_>
                           );
  if (!NAN(*psVar4)) {
    __assert_fail("v != v",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x89,"void test_evp_fp_nan()");
  }
  psVar4 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_fp_nan<double>_>::
           unsafe_raw_value(&local_18.
                             super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_fp_nan<double>_>
                           );
  dVar1 = *psVar4;
  if ((dVar1 != 1.0) || (NAN(dVar1))) {
    __assert_fail("v == 1.0",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x8c,"void test_evp_fp_nan()");
  }
  if (NAN(dVar1)) {
    __assert_fail("v == v",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x8d,"void test_evp_fp_nan()");
  }
  psVar4 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_fp_nan<double>_>::
           unsafe_raw_value(&local_28.
                             super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_fp_nan<double>_>
                           );
  if (NAN(*psVar4)) {
    return;
  }
  __assert_fail("v != v",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                ,0x90,"void test_evp_fp_nan()");
}

Assistant:

void test_evp_fp_nan()
{
  typedef compact_optional<evp_fp_nan<double>> opt_double;
  opt_double o_, o1 (1.0), oNan (0.0/0.0);
  assert (!o_.has_value());
  assert ( o1.has_value());
  assert (!oNan.has_value());
  
  assert (o1.value() == 1.0);
  
  double v = o_.unsafe_raw_value();
  assert (v != v);
  
  v = o1.unsafe_raw_value();
  assert (v == 1.0);
  assert (v == v);
  
  v = oNan.unsafe_raw_value();
  assert (v != v);
}